

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelAnimation *skelanim,uint32_t indent,
          bool closing_brace)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_00;
  uint indent_01;
  stringstream ss;
  allocator local_20d;
  uint32_t local_20c;
  string local_208;
  pprint *local_1e8;
  string *local_1e0;
  undefined1 local_1d8 [48];
  ostream local_1a8 [376];
  
  indent_00 = CONCAT31(in_register_00000081,closing_brace);
  local_20c = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x20));
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)skelanim & 0xffffffff),n);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  to_string_abi_cxx11_((string *)local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar3 = ::std::operator<<(poVar3,(string *)local_1d8);
  poVar3 = ::std::operator<<(poVar3," SkelAnimation \"");
  poVar3 = ::std::operator<<(poVar3,(string *)this);
  ::std::operator<<(poVar3,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0xf50));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)skelanim & 0xffffffff),n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_
              (&local_208,this + 0xf50,(PrimMeta *)(ulong)((int)skelanim + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)skelanim & 0xffffffff),n_01);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_01 = (int)skelanim + 1;
  local_1e8 = (pprint *)((ulong)skelanim & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)skelanim & 0xffffffff),n_02);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::operator<<(poVar3,"{\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"blendShapes",&local_20d);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_208,this + 0x30,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"blendShapeWeights",&local_20d);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_208,this + 0x280,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"joints",&local_20d);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_208,this + 0x4f8,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"rotations",&local_20d);
  print_typed_attr<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
            (&local_208,this + 0x748,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              *)local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"scales",&local_20d);
  print_typed_attr<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
            (&local_208,this + 0x9c0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              *)local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1d8,"translations",&local_20d);
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            (&local_208,this + 0xc38,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_1d8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_208,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0xf20),indent_01);
  ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_20c != '\0') {
    pprint::Indent_abi_cxx11_(&local_208,local_1e8,n_03);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x20));
  return psVar1;
}

Assistant:

std::string to_string(const SkelAnimation &skelanim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(skelanim.spec)
     << " SkelAnimation \"" << skelanim.name << "\"\n";
  if (skelanim.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(skelanim.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(skelanim.blendShapes, "blendShapes", indent + 1);
  ss << print_typed_attr(skelanim.blendShapeWeights, "blendShapeWeights",
                         indent + 1);
  ss << print_typed_attr(skelanim.joints, "joints", indent + 1);
  ss << print_typed_attr(skelanim.rotations, "rotations", indent + 1);
  ss << print_typed_attr(skelanim.scales, "scales", indent + 1);
  ss << print_typed_attr(skelanim.translations, "translations", indent + 1);

  ss << print_props(skelanim.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}